

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

SPIRType * __thiscall
diligent_spirv_cross::CompilerGLSL::binary_op_bitcast_helper
          (SPIRType *__return_storage_ptr__,CompilerGLSL *this,string *cast_op0,string *cast_op1,
          BaseType *input_type,uint32_t op0,uint32_t op1,bool skip_cast_if_equal_type)

{
  uint32_t uVar1;
  SPIRType *pSVar2;
  SPIRType *pSVar3;
  bool bVar4;
  SPIRType *expected_type;
  string local_50;
  
  pSVar2 = Compiler::expression_type(&this->super_Compiler,op0);
  pSVar3 = Compiler::expression_type(&this->super_Compiler,op1);
  bVar4 = pSVar2->basetype != pSVar3->basetype;
  if (!skip_cast_if_equal_type && !bVar4) {
    bVar4 = pSVar2->basetype != *input_type;
  }
  SPIRType::SPIRType(__return_storage_ptr__,*(Op *)&(pSVar2->super_IVariant).field_0xc);
  __return_storage_ptr__->basetype = *input_type;
  __return_storage_ptr__->columns = pSVar2->columns;
  uVar1 = pSVar2->vecsize;
  __return_storage_ptr__->width = pSVar2->width;
  __return_storage_ptr__->vecsize = uVar1;
  if (bVar4) {
    bitcast_glsl_abi_cxx11_(&local_50,this,__return_storage_ptr__,op0);
    ::std::__cxx11::string::operator=((string *)cast_op0,(string *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    bitcast_glsl_abi_cxx11_(&local_50,this,__return_storage_ptr__,op1);
    ::std::__cxx11::string::operator=((string *)cast_op1,(string *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  else {
    to_enclosed_unpacked_expression_abi_cxx11_(&local_50,this,op0,true);
    ::std::__cxx11::string::operator=((string *)cast_op0,(string *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    to_enclosed_unpacked_expression_abi_cxx11_(&local_50,this,op1,true);
    ::std::__cxx11::string::operator=((string *)cast_op1,(string *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    *input_type = pSVar2->basetype;
  }
  return __return_storage_ptr__;
}

Assistant:

SPIRType CompilerGLSL::binary_op_bitcast_helper(string &cast_op0, string &cast_op1, SPIRType::BaseType &input_type,
                                                uint32_t op0, uint32_t op1, bool skip_cast_if_equal_type)
{
	auto &type0 = expression_type(op0);
	auto &type1 = expression_type(op1);

	// We have to bitcast if our inputs are of different type, or if our types are not equal to expected inputs.
	// For some functions like OpIEqual and INotEqual, we don't care if inputs are of different types than expected
	// since equality test is exactly the same.
	bool cast = (type0.basetype != type1.basetype) || (!skip_cast_if_equal_type && type0.basetype != input_type);

	// Create a fake type so we can bitcast to it.
	// We only deal with regular arithmetic types here like int, uints and so on.
	SPIRType expected_type{type0.op};
	expected_type.basetype = input_type;
	expected_type.vecsize = type0.vecsize;
	expected_type.columns = type0.columns;
	expected_type.width = type0.width;

	if (cast)
	{
		cast_op0 = bitcast_glsl(expected_type, op0);
		cast_op1 = bitcast_glsl(expected_type, op1);
	}
	else
	{
		// If we don't cast, our actual input type is that of the first (or second) argument.
		cast_op0 = to_enclosed_unpacked_expression(op0);
		cast_op1 = to_enclosed_unpacked_expression(op1);
		input_type = type0.basetype;
	}

	return expected_type;
}